

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

void __thiscall Reducer::visitModule(Reducer *this,Module *curr)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> __args;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *puVar3;
  long *plVar4;
  Expression *parent;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pEVar11;
  bool bVar12;
  Index IVar13;
  Index IVar14;
  ostream *poVar15;
  long lVar16;
  undefined8 *puVar17;
  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
  _Var18;
  Type TVar19;
  int *piVar20;
  int iVar21;
  ulong uVar22;
  HeapType HVar23;
  ulong uVar24;
  Index index;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar25;
  long lVar26;
  Name NVar27;
  Name NVar28;
  Signature SVar29;
  Export exp_2;
  undefined1 auStack_b8 [8];
  ProgramResult result;
  pointer local_80;
  pointer pEStack_78;
  vector<wasm::Export,_std::allocator<wasm::Export>_> exports;
  HeapType HStack_58;
  vector<wasm::Export,_std::allocator<wasm::Export>_> currExports;
  ulong local_38;
  
  if ((this->module)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl != curr) {
    __assert_fail("curr == module.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                  ,0x3d5,"void Reducer::visitModule(Module *)");
  }
  do {
    bVar12 = reduceFunctions(this);
  } while (bVar12);
  shrinkElementSegments(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|    try to remove exports (with factor ",0x28);
  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->factor);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,")\n",2);
  pEStack_78 = (pointer)0x0;
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar25 = *(pointer *)
             &(pMVar1->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            + 8);
  if (puVar25 != puVar2) {
    do {
      __args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (puVar25->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
      if (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start ==
          exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Export,std::allocator<wasm::Export>>::
        _M_realloc_insert<wasm::Export_const&>
                  ((vector<wasm::Export,std::allocator<wasm::Export>> *)&pEStack_78,
                   (iterator)
                   exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (Export *)
                   __args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
      }
      else {
        uVar5 = *(undefined8 *)
                 __args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                 .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        uVar6 = *(undefined8 *)
                 ((long)__args.
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8);
        uVar7 = *(undefined8 *)
                 ((long)__args.
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x10);
        uVar8 = *(undefined8 *)
                 ((long)__args.
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x18);
        uVar9 = *(undefined8 *)
                 ((long)__args.
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x28);
        *(undefined8 *)
         (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start + 0x20) =
             *(undefined8 *)
              ((long)__args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                     .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x20);
        *(undefined8 *)
         (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start + 0x28) = uVar9;
        *(undefined8 *)
         (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start + 0x10) = uVar7;
        *(undefined8 *)
         (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start + 0x18) = uVar8;
        *(undefined8 *)
         exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
         super__Vector_impl_data._M_start = uVar5;
        *(undefined8 *)
         (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start + 8) = uVar6;
        exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
        super__Vector_impl_data._M_start =
             exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
             super__Vector_impl_data._M_start + 0x30;
      }
      puVar25 = puVar25 + 1;
    } while (puVar25 != puVar2);
  }
  if (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
      super__Vector_impl_data._M_start != pEStack_78) {
    uVar24 = 0;
    local_38 = 1;
    do {
      iVar21 = this->factor / 100;
      if (iVar21 < 1000) {
        iVar21 = 999;
      }
      bVar12 = shouldTryToReduce(this,(ulong)(iVar21 + 1));
      if (bVar12) {
        HStack_58.id = 0;
        currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (local_38 != 0) {
          lVar26 = uVar24 * 0x30;
          uVar22 = uVar24 - 1;
          do {
            uVar22 = uVar22 + 1;
            if ((ulong)(((long)exports.
                               super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)pEStack_78 >> 4) *
                       -0x5555555555555555) <= uVar22) break;
            auStack_b8 = *(undefined1 (*) [8])(pEStack_78 + lVar26);
            result._0_8_ = *(undefined8 *)(pEStack_78 + lVar26 + 8);
            result.output._M_dataplus._M_p = *(pointer *)(pEStack_78 + lVar26 + 0x10);
            result.output._M_string_length = *(size_type *)(pEStack_78 + lVar26 + 0x10 + 8);
            result.output.field_2._M_allocated_capacity =
                 *(undefined8 *)(pEStack_78 + lVar26 + 0x20);
            result.output.field_2._8_8_ = *(undefined8 *)(pEStack_78 + lVar26 + 0x20 + 8);
            NVar27.super_IString.str._M_str = (char *)auStack_b8;
            NVar27.super_IString.str._M_len =
                 (size_t)(this->module)._M_t.
                         super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
            lVar16 = wasm::Module::getExportOrNull(NVar27);
            if (lVar16 != 0) {
              if (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                std::vector<wasm::Export,std::allocator<wasm::Export>>::
                _M_realloc_insert<wasm::Export_const&>
                          ((vector<wasm::Export,std::allocator<wasm::Export>> *)&HStack_58,
                           (iterator)
                           currExports.
                           super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
                           super__Vector_impl_data._M_start,(Export *)auStack_b8);
              }
              else {
                *(size_type *)
                 (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x20) =
                     result.output.field_2._M_allocated_capacity;
                *(undefined8 *)
                 (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x28) = result.output.field_2._8_8_;
                *(pointer *)
                 (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x10) = result.output._M_dataplus._M_p;
                *(size_type *)
                 (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x18) = result.output._M_string_length;
                *(undefined1 (*) [8])
                 currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl
                 .super__Vector_impl_data._M_start = auStack_b8;
                *(undefined8 *)
                 (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start + 8) = result._0_8_;
                currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
                super__Vector_impl_data._M_start =
                     currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x30;
              }
              NVar28.super_IString.str._M_str = (char *)auStack_b8;
              NVar28.super_IString.str._M_len =
                   (size_t)(this->module)._M_t.
                           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                           .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
              wasm::Module::removeExport(NVar28);
            }
            lVar26 = lVar26 + 0x30;
          } while ((ulong)(((long)((long)currExports.
                                         super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                         ._M_impl.super__Vector_impl_data._M_start - HStack_58.id)
                           >> 4) * -0x5555555555555555) < local_38);
        }
        result._0_8_ = &result.output._M_string_length;
        result.output._M_dataplus._M_p = (pointer)0x0;
        result.output._M_string_length = result.output._M_string_length & 0xffffffffffffff00;
        bVar12 = writeAndTestReduction(this,(ProgramResult *)auStack_b8);
        pEVar11 = currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        HVar23.id = HStack_58.id;
        if (bVar12) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"|      removed ",0xf);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," exports\n",9);
          this->reduced =
               this->reduced +
               ((long)((long)currExports.
                             super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl
                             .super__Vector_impl_data._M_start - HStack_58.id) >> 4) *
               -0x5555555555555555;
          applyTestToWorking(this);
          uVar24 = uVar24 + local_38;
          local_38 = local_38 * 2;
          if ((ulong)(long)this->factor <= local_38) {
            local_38 = (long)this->factor;
          }
        }
        else {
          for (; (pointer)HVar23.id != pEVar11; HVar23.id = (uintptr_t)(HVar23.id + 0x30)) {
            uVar5 = *(undefined8 *)HVar23.id;
            uVar6 = *(undefined8 *)(HVar23.id + 8);
            uVar7 = *(undefined8 *)(HVar23.id + 0x10);
            uVar8 = *(undefined8 *)(HVar23.id + 0x18);
            uVar9 = *(undefined8 *)(HVar23.id + 0x20);
            uVar10 = *(undefined8 *)(HVar23.id + 0x28);
            pMVar1 = (this->module)._M_t.
                     super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                     super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
            puVar17 = (undefined8 *)operator_new(0x30);
            puVar17[4] = uVar9;
            puVar17[5] = uVar10;
            puVar17[2] = uVar7;
            puVar17[3] = uVar8;
            *puVar17 = uVar5;
            puVar17[1] = uVar6;
            wasm::Module::addExport((Export *)pMVar1);
          }
          bVar12 = local_38 < 2;
          local_38 = local_38 >> 1;
          if (bVar12) {
            local_38 = 1;
          }
        }
        if ((size_type *)result._0_8_ != &result.output._M_string_length) {
          operator_delete((void *)result._0_8_,result.output._M_string_length + 1);
        }
        if ((pointer)HStack_58.id != (pointer)0x0) {
          operator_delete((void *)HStack_58.id,
                          (long)currExports.
                                super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                _M_impl.super__Vector_impl_data._M_finish - HStack_58.id);
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < (ulong)(((long)exports.
                                     super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)pEStack_78 >>
                              4) * -0x5555555555555555));
  }
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar3 = *(pointer *)
            ((long)&(pMVar1->elementSegments).
                    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            + 8);
  _Var18 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,__gnu_cxx::__ops::_Iter_negate<Reducer::visitModule(wasm::Module*)::_lambda(auto:1&)_1_>>
                     (*(undefined8 *)
                       &(pMVar1->elementSegments).
                        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                        ._M_impl,puVar3);
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  plVar4 = *(long **)&(pMVar1->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl;
  if (((((long)*(pointer *)
                ((long)&(pMVar1->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                + 8) - (long)plVar4 == 8) && (_Var18._M_current == puVar3)) &&
      (*(pointer *)
        &(pMVar1->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       == *(pointer *)
           ((long)&(pMVar1->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           + 8))) && (lVar26 = *plVar4, *(long *)(lVar26 + 0x20) == 0)) {
    parent = *(Expression **)(lVar26 + 0x60);
    if (((0x34 < (ulong)parent->_id) ||
        ((0x1000000000000aU >> ((ulong)parent->_id & 0x3f) & 1) == 0)) || (parent[1].type.id == 0))
    {
      uVar5 = *(undefined8 *)(lVar26 + 0x38);
      wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)auStack_b8,parent);
      IVar13 = (int)((ulong)((long)result.time - result.output.field_2._8_8_) >> 3) +
               auStack_b8._0_4_;
      if (IVar13 != 0) {
        index = 0;
        do {
          IVar14 = wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex
                             ((AbstractChildIterator<wasm::ChildIterator> *)auStack_b8,index);
          piVar20 = (int *)(result.output.field_2._8_8_ + -0x20 + (ulong)IVar14 * 8);
          if (IVar14 < 4) {
            piVar20 = &result.code + (ulong)IVar14 * 2;
          }
          lVar16 = **(long **)piVar20;
          iVar21 = 0xf;
          if (*(long *)(lVar16 + 8) != 1) {
            TVar19.id = wasm::HeapType::getSignature();
            SVar29.results.id = *(uintptr_t *)(lVar16 + 8);
            SVar29.params.id = TVar19.id;
            wasm::HeapType::HeapType(&HStack_58,SVar29);
            *(uintptr_t *)(lVar26 + 0x38) = HStack_58.id;
            *(long *)(lVar26 + 0x60) = lVar16;
            bVar12 = writeAndTestReduction(this);
            if (bVar12) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"|    altered function result type\n",0x22);
              this->reduced = this->reduced + 1;
              iVar21 = 0xe;
              applyTestToWorking(this);
            }
            else {
              *(undefined8 *)(lVar26 + 0x38) = uVar5;
              *(Expression **)(lVar26 + 0x60) = parent;
              iVar21 = 0;
            }
          }
        } while (((iVar21 == 0xf) || (iVar21 == 0)) && (index = index + 1, IVar13 != index));
      }
      if (result.output.field_2._8_8_ != 0) {
        operator_delete((void *)result.output.field_2._8_8_,
                        (long)local_80 - result.output.field_2._8_8_);
      }
    }
  }
  if (pEStack_78 != (pointer)0x0) {
    operator_delete(pEStack_78,
                    (long)exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pEStack_78);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    // The initial module given to us is our global object. As we continue to
    // process things here, we may replace the module, so we should never again
    // refer to curr.
    assert(curr == module.get());
    curr = nullptr;

    // Reduction of entire functions at a time is very effective, and we do it
    // with exponential growth and backoff, so keep doing it while it works.
    while (reduceFunctions()) {
    }

    shrinkElementSegments();

    // try to remove exports
    std::cerr << "|    try to remove exports (with factor " << factor << ")\n";
    std::vector<Export> exports;
    for (auto& exp : module->exports) {
      exports.push_back(*exp);
    }
    size_t skip = 1;
    for (size_t i = 0; i < exports.size(); i++) {
      if (!shouldTryToReduce(std::max((factor / 100) + 1, 1000))) {
        continue;
      }
      std::vector<Export> currExports;
      for (size_t j = 0; currExports.size() < skip && i + j < exports.size();
           j++) {
        auto exp = exports[i + j];
        if (module->getExportOrNull(exp.name)) {
          currExports.push_back(exp);
          module->removeExport(exp.name);
        }
      }
      ProgramResult result;
      if (!writeAndTestReduction(result)) {
        for (auto exp : currExports) {
          module->addExport(new Export(exp));
        }
        skip = std::max(skip / 2, size_t(1)); // or 1?
      } else {
        std::cerr << "|      removed " << currExports.size() << " exports\n";
        noteReduction(currExports.size());
        i += skip;
        skip = std::min(size_t(factor), 2 * skip);
      }
    }
    // If we are left with a single function that is not exported or used in
    // a table, that is useful as then we can change the return type.
    bool allTablesEmpty =
      std::all_of(module->elementSegments.begin(),
                  module->elementSegments.end(),
                  [&](auto& segment) { return segment->data.empty(); });

    if (module->functions.size() == 1 && module->exports.empty() &&
        allTablesEmpty) {
      auto* func = module->functions[0].get();
      // We can't remove something that might have breaks to it.
      if (!func->imported() && !Properties::isNamedControlFlow(func->body)) {
        auto funcType = func->type;
        auto* funcBody = func->body;
        for (auto* child : ChildIterator(func->body)) {
          if (!(child->type.isConcrete() || child->type == Type::none)) {
            continue; // not something a function can return
          }
          // Try to replace the body with the child, fixing up the function
          // to accept it.
          func->type = Signature(funcType.getSignature().params, child->type);
          func->body = child;
          if (writeAndTestReduction()) {
            // great, we succeeded!
            std::cerr << "|    altered function result type\n";
            noteReduction(1);
            break;
          }
          // Undo.
          func->type = funcType;
          func->body = funcBody;
        }
      }
    }
  }